

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O2

void __thiscall
TidyConfigParser::toggleCheck
          (TidyConfigParser *this,string *groupName,string *checkName,CheckStatus status)

{
  bool bVar1;
  optional<slang::TidyKind> oVar2;
  undefined8 extraout_RAX;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string local_a8;
  TidyConfigParser *local_80;
  string local_78;
  string local_50;
  
  this_00 = &local_a8;
  if (checkName->_M_string_length == 0) {
    local_78._M_dataplus._M_p = (groupName->_M_dataplus)._M_p;
    local_78._M_string_length = groupName->_M_string_length;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x48;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_78;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_a8,
               (v11 *)"Empty check name in group {0}, you can toggle the whole group with {0}-*",
               fmt_00,args_00);
    reportWarning(this,&local_a8);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,groupName);
    oVar2 = slang::tidyKindFromStr(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (((ulong)oVar2.super__Optional_base<slang::TidyKind,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TidyKind> >> 0x20 & 1) == 0) {
      local_78._M_dataplus._M_p = (groupName->_M_dataplus)._M_p;
      local_78._M_string_length = groupName->_M_string_length;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x17;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_78;
      ::fmt::v11::vformat_abi_cxx11_(&local_a8,(v11 *)"Group {} does not exist",fmt_01,args_01);
      reportErrorAndExit(this,&local_a8);
      std::__cxx11::string::~string((string *)&local_78);
      _Unwind_Resume(extraout_RAX);
    }
    local_80 = this;
    formatCheckName(&local_a8,checkName);
    bVar1 = TidyConfig::toggleCheck
                      (&this->config,
                       oVar2.super__Optional_base<slang::TidyKind,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::TidyKind>._M_payload,&local_a8,status);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      return;
    }
    local_a8._M_dataplus._M_p = (checkName->_M_dataplus)._M_p;
    local_a8._M_string_length = checkName->_M_string_length;
    local_a8.field_2._M_allocated_capacity = (size_type)(groupName->_M_dataplus)._M_p;
    local_a8.field_2._8_8_ = groupName->_M_string_length;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x28;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_78,(v11 *)"Check name {} does not exist in group {}",fmt,args);
    reportWarning(local_80,&local_78);
    this_00 = &local_78;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void TidyConfigParser::toggleCheck(const std::string& groupName, const std::string& checkName,
                                   TidyConfig::CheckStatus status) {
    if (checkName.empty()) {
        reportWarning(fmt::format(
            "Empty check name in group {0}, you can toggle the whole group with {0}-*", groupName));
        return;
    }

    auto kind = slang::tidyKindFromStr(groupName);
    if (!kind)
        reportErrorAndExit(fmt::format("Group {} does not exist", groupName));
    bool found = config.toggleCheck(kind.value(), formatCheckName(checkName), status);

    if (!found)
        reportWarning(
            fmt::format("Check name {} does not exist in group {}", checkName, groupName));
}